

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

unsigned_long __thiscall gimage::Histogram::sumAll(Histogram *this)

{
  unsigned_long uVar1;
  long lVar2;
  ulong uVar3;
  
  if (0 < (long)*(int *)(this + 4)) {
    lVar2 = 0;
    uVar1 = 0;
    do {
      if (0 < (int)*(uint *)this) {
        uVar3 = 0;
        do {
          uVar1 = uVar1 + *(long *)(*(long *)(*(long *)(this + 0x18) + lVar2 * 8) + uVar3 * 8);
          uVar3 = uVar3 + 1;
        } while (*(uint *)this != uVar3);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != *(int *)(this + 4));
    return uVar1;
  }
  return 0;
}

Assistant:

unsigned long Histogram::sumAll() const
{
  unsigned long ret=0;

  for (int k=0; k<h; k++)
  {
    for (int i=0; i<w; i++)
    {
      ret+=row[k][i];
    }
  }

  return ret;
}